

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValue.cpp
# Opt level: O0

Url * __thiscall
Vault::KeyValue::getMetadataUrl(Url *__return_storage_ptr__,KeyValue *this,Path *path)

{
  Client *pCVar1;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  Path *local_20;
  Path *path_local;
  KeyValue *this_local;
  
  pCVar1 = this->client_;
  local_20 = path;
  path_local = (Path *)this;
  this_local = (KeyValue *)__return_storage_ptr__;
  Vault::operator+(&local_60,"/v1/",&this->mount_);
  std::operator+(&local_40,&local_60,"/metadata/");
  (*pCVar1->_vptr_Client[3])(__return_storage_ptr__,pCVar1,&local_40,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

Vault::Url Vault::KeyValue::getMetadataUrl(const Vault::Path &path) {
  return Vault::Url{client_.getUrl("/v1/" + mount_ + "/metadata/", path)};
}